

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_influence.h
# Opt level: O2

void __thiscall
xray_re::_influence<unsigned_int,_float>::set_wo_reorder
          (_influence<unsigned_int,_float> *this,uint16_t bone0,uint16_t bone1,float weight0)

{
  undefined6 in_register_00000032;
  _bone_weight<unsigned_int,_float> *value;
  _bone_weight<unsigned_int,_float> bw0;
  _bone_weight<unsigned_int,_float> bw1;
  _bone_weight<unsigned_int,_float> local_20;
  _bone_weight<unsigned_int,_float> local_18;
  
  local_20.bone = (uint)CONCAT62(in_register_00000032,bone0);
  if (bone0 == bone1) {
    value = &local_20;
    local_20.weight = 1.0;
  }
  else {
    local_20.weight = 1.0 - weight0;
    value = &local_18;
    local_18.bone = (uint)bone1;
    local_18.weight = weight0;
    _svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>::push_back
              (&this->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>,&local_20);
  }
  _svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>::push_back
            (&this->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>,value);
  return;
}

Assistant:

void _influence<Tb, Tw>::set_wo_reorder(uint16_t bone0, uint16_t bone1, float weight0)
{
	if (bone0 == bone1) {
		push_back(_bone_weight<Tb, Tw>(bone0, Tw(1)));
	} else {
		_bone_weight<Tb, Tw> bw0(bone0, Tw(1.f - weight0));
		_bone_weight<Tb, Tw> bw1(bone1, Tw(weight0));
		push_back(bw0);
		push_back(bw1);
	}
}